

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O3

shared_ptr<QPDFWriter> __thiscall FuzzHelper::getWriter(FuzzHelper *this,shared_ptr<QPDF> *qpdf)

{
  QPDF *__args;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFWriter> sVar1;
  undefined1 local_19;
  
  __args = (QPDF *)*in_RDX;
  (this->input_buffer).m._M_t.
  super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false> = (_Head_base<0UL,_Buffer::Members_*,_false>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFWriter,std::allocator<QPDFWriter>,QPDF&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->discard,(QPDFWriter **)this,
             (allocator<QPDFWriter> *)&local_19,__args);
  QPDFWriter::setOutputPipeline
            ((QPDFWriter *)
             (this->input_buffer).m._M_t.
             super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
             super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
             super__Head_base<0UL,_Buffer::Members_*,_false>,
             (Pipeline *)&(qpdf->super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  QPDFWriter::setDecodeLevel
            ((QPDFWriter *)
             (this->input_buffer).m._M_t.
             super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
             super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
             super__Head_base<0UL,_Buffer::Members_*,_false>,qpdf_dl_all);
  sVar1.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFWriter>)sVar1.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFWriter>
FuzzHelper::getWriter(std::shared_ptr<QPDF> qpdf)
{
    auto w = std::make_shared<QPDFWriter>(*qpdf);
    w->setOutputPipeline(&this->discard);
    w->setDecodeLevel(qpdf_dl_all);
    return w;
}